

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O2

boolean decode_mcu(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  jpeg_entropy_decoder *pjVar1;
  int *piVar2;
  JBLOCKROW paJVar3;
  jpeg_component_info *pjVar4;
  jpeg_error_mgr *pjVar5;
  ushort uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  _func_boolean_j_decompress_ptr_JBLOCKROW_ptr *p_Var16;
  long lVar17;
  int *piVar18;
  
  pjVar1 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    iVar15 = *(int *)((long)&pjVar1[4].start_pass + 4);
    if (iVar15 == 0) {
      process_restart(cinfo);
      iVar15 = *(int *)((long)&pjVar1[4].start_pass + 4);
    }
    *(int *)((long)&pjVar1[4].start_pass + 4) = iVar15 + -1;
  }
  if (*(int *)&pjVar1[2].start_pass != -1) {
    piVar2 = cinfo->natural_order;
    for (lVar12 = 0; lVar12 < cinfo->blocks_in_MCU; lVar12 = lVar12 + 1) {
      paJVar3 = MCU_data[lVar12];
      lVar17 = (long)cinfo->MCU_membership[lVar12];
      pjVar4 = cinfo->cur_comp_info[lVar17];
      iVar15 = pjVar4->dc_tbl_no;
      p_Var16 = (&pjVar1[4].decode_mcu)[iVar15] +
                *(int *)((long)&pjVar1[3].start_pass + lVar17 * 4 + 4);
      iVar7 = arith_decode(cinfo,(uchar *)p_Var16);
      if (iVar7 == 0) {
        *(undefined4 *)((long)&pjVar1[3].start_pass + lVar17 * 4 + 4) = 0;
        iVar15 = *(int *)((long)&pjVar1[2].start_pass + lVar17 * 4 + 4);
      }
      else {
        uVar8 = arith_decode(cinfo,(uchar *)(p_Var16 + 1));
        p_Var16 = p_Var16 + (ulong)uVar8 + 2;
        iVar7 = arith_decode(cinfo,(uchar *)p_Var16);
        uVar14 = 0;
        if (iVar7 != 0) {
          p_Var16 = (&pjVar1[4].decode_mcu)[iVar15] + 0x14;
          uVar14 = 1;
          while (iVar7 = arith_decode(cinfo,(uchar *)p_Var16), iVar7 != 0) {
            uVar14 = uVar14 * 2;
            if (uVar14 == 0x8000) {
LAB_0011349e:
              pjVar5 = cinfo->err;
              pjVar5->msg_code = 0x75;
              (*pjVar5->emit_message)((j_common_ptr)cinfo,-1);
              *(undefined4 *)&pjVar1[2].start_pass = 0xffffffff;
              return 1;
            }
            p_Var16 = p_Var16 + 1;
          }
        }
        iVar7 = 0;
        if ((int)((ulong)(1L << (cinfo->arith_dc_L[iVar15] & 0x3f)) >> 1) <= (int)uVar14) {
          if ((int)((ulong)(1L << (cinfo->arith_dc_U[iVar15] & 0x3f)) >> 1) < (int)uVar14) {
            iVar7 = uVar8 * 4 + 0xc;
          }
          else {
            iVar7 = uVar8 * 4 + 4;
          }
        }
        *(int *)((long)&pjVar1[3].start_pass + lVar17 * 4 + 4) = iVar7;
        uVar13 = uVar14;
        while (1 < uVar13) {
          uVar13 = (int)uVar13 >> 1;
          uVar9 = arith_decode(cinfo,(uchar *)(p_Var16 + 0xe));
          if (uVar9 != 0) {
            uVar9 = uVar13;
          }
          uVar14 = uVar14 | uVar9;
        }
        uVar13 = ~uVar14;
        if (uVar8 == 0) {
          uVar13 = uVar14 + 1;
        }
        iVar15 = uVar13 + *(int *)((long)&pjVar1[2].start_pass + lVar17 * 4 + 4);
        *(int *)((long)&pjVar1[2].start_pass + lVar17 * 4 + 4) = iVar15;
      }
      (*paJVar3)[0] = (JCOEF)iVar15;
      if (cinfo->lim_Se != 0) {
        iVar15 = pjVar4->ac_tbl_no;
        iVar7 = 0;
        do {
          p_Var16 = (&pjVar1[0xc].decode_mcu)[iVar15];
          iVar10 = arith_decode(cinfo,(uchar *)(p_Var16 + iVar7 * 3));
          if (iVar10 != 0) break;
          p_Var16 = p_Var16 + (long)(iVar7 * 3) + 2;
          piVar18 = piVar2 + (iVar7 + 1);
          while (iVar10 = arith_decode(cinfo,(uchar *)(p_Var16 + -1)), iVar10 == 0) {
            iVar7 = iVar7 + 1;
            p_Var16 = p_Var16 + 3;
            piVar18 = piVar18 + 1;
            if (cinfo->lim_Se <= iVar7) goto LAB_0011349e;
          }
          iVar10 = arith_decode(cinfo,(uchar *)&pjVar1[0x14].decode_mcu);
          iVar11 = arith_decode(cinfo,(uchar *)p_Var16);
          if (iVar11 == 0) {
            uVar14 = 0;
          }
          else {
            iVar11 = arith_decode(cinfo,(uchar *)p_Var16);
            uVar14 = 1;
            if (iVar11 != 0) {
              lVar17 = 0xd9;
              if (iVar7 < (int)(uint)cinfo->arith_ac_K[iVar15]) {
                lVar17 = 0xbd;
              }
              p_Var16 = (&pjVar1[0xc].decode_mcu)[iVar15] + lVar17;
              uVar14 = 2;
              while (iVar11 = arith_decode(cinfo,(uchar *)p_Var16), iVar11 != 0) {
                uVar14 = uVar14 * 2;
                if (uVar14 == 0x8000) goto LAB_0011349e;
                p_Var16 = p_Var16 + 1;
              }
            }
          }
          iVar7 = iVar7 + 1;
          uVar8 = uVar14;
          while (1 < uVar8) {
            uVar8 = (int)uVar8 >> 1;
            uVar13 = arith_decode(cinfo,(uchar *)(p_Var16 + 0xe));
            if (uVar13 != 0) {
              uVar13 = uVar8;
            }
            uVar14 = uVar14 | uVar13;
          }
          uVar6 = ~(ushort)uVar14;
          if (iVar10 == 0) {
            uVar6 = (ushort)uVar14 + 1;
          }
          (*paJVar3)[*piVar18] = uVar6;
        } while (iVar7 < cinfo->lim_Se);
      }
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  jpeg_component_info * compptr;
  JBLOCKROW block;
  unsigned char *st;
  int blkn, ci, tbl, sign, k;
  int v, m;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* Outer loop handles each block in the MCU */

  for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
    block = MCU_data[blkn];
    ci = cinfo->MCU_membership[blkn];
    compptr = cinfo->cur_comp_info[ci];

    /* Sections F.2.4.1 & F.1.4.4.1: Decoding of DC coefficients */

    tbl = compptr->dc_tbl_no;

    /* Table F.4: Point to statistics bin S0 for DC coefficient coding */
    st = entropy->dc_stats[tbl] + entropy->dc_context[ci];

    /* Figure F.19: Decode_DC_DIFF */
    if (arith_decode(cinfo, st) == 0)
      entropy->dc_context[ci] = 0;
    else {
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, st + 1);
      st += 2; st += sign;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	st = entropy->dc_stats[tbl] + 20;	/* Table F.4: X1 = 20 */
	while (arith_decode(cinfo, st)) {
	  if ((m <<= 1) == 0x8000) {
	    WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	    entropy->ct = -1;			/* magnitude overflow */
	    return TRUE;
	  }
	  st += 1;
	}
      }
      /* Section F.1.4.4.1.2: Establish dc_context conditioning category */
      if (m < (int) ((1L << cinfo->arith_dc_L[tbl]) >> 1))
	entropy->dc_context[ci] = 0;		   /* zero diff category */
      else if (m > (int) ((1L << cinfo->arith_dc_U[tbl]) >> 1))
	entropy->dc_context[ci] = 12 + (sign * 4); /* large diff category */
      else
	entropy->dc_context[ci] = 4 + (sign * 4);  /* small diff category */
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      entropy->last_dc_val[ci] += v;
    }

    (*block)[0] = (JCOEF) entropy->last_dc_val[ci];

    /* Sections F.2.4.2 & F.1.4.4.2: Decoding of AC coefficients */

    if (cinfo->lim_Se == 0) continue;
    tbl = compptr->ac_tbl_no;
    k = 0;

    /* Figure F.20: Decode_AC_coefficients */
    do {
      st = entropy->ac_stats[tbl] + 3 * k;
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
      for (;;) {
	k++;
	if (arith_decode(cinfo, st + 1)) break;
	st += 3;
	if (k >= cinfo->lim_Se) {
	  WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	  entropy->ct = -1;			/* spectral overflow */
	  return TRUE;
	}
      }
      /* Figure F.21: Decoding nonzero value v */
      /* Figure F.22: Decoding the sign of v */
      sign = arith_decode(cinfo, entropy->fixed_bin);
      st += 2;
      /* Figure F.23: Decoding the magnitude category of v */
      if ((m = arith_decode(cinfo, st)) != 0) {
	if (arith_decode(cinfo, st)) {
	  m <<= 1;
	  st = entropy->ac_stats[tbl] +
	       (k <= cinfo->arith_ac_K[tbl] ? 189 : 217);
	  while (arith_decode(cinfo, st)) {
	    if ((m <<= 1) == 0x8000) {
	      WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	      entropy->ct = -1;			/* magnitude overflow */
	      return TRUE;
	    }
	    st += 1;
	  }
	}
      }
      v = m;
      /* Figure F.24: Decoding the magnitude bit pattern of v */
      st += 14;
      while (m >>= 1)
	if (arith_decode(cinfo, st)) v |= m;
      v += 1; if (sign) v = -v;
      (*block)[natural_order[k]] = (JCOEF) v;
    } while (k < cinfo->lim_Se);
  }

  return TRUE;
}